

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int check_path_priorities_internal(VecZNode *path)

{
  PNode *pPVar1;
  ZNode *pZVar2;
  ZNode *pZVar3;
  ZNode *pZVar4;
  bool bVar5;
  int iVar6;
  PNode *pn1;
  PNode *pn0;
  ZNode *zzz;
  ZNode *zz;
  ZNode *z;
  uint one;
  uint kk;
  uint jj;
  uint k;
  uint j;
  uint i;
  VecZNode *path_local;
  
  k = 0;
  bVar5 = false;
  if (path->n == 0) {
    return 0;
  }
  pPVar1 = (*path->v)->pn;
  pn1 = pPVar1;
  if (pPVar1->op_assoc == ASSOC_NONE) {
    k = 1;
    if (path->n < 2) {
      return 0;
    }
    pn1 = path->v[1]->pn;
    if (pn1->op_assoc == ASSOC_NONE) {
      return 0;
    }
    if ((pPVar1->assoc != ASSOC_NONE) &&
       (iVar6 = check_child(pn1->op_priority,pn1->op_assoc,pPVar1->priority,pPVar1->assoc,0,1),
       iVar6 == 0)) {
      return -1;
    }
  }
  if (k + 1 < path->n) {
    pPVar1 = path->v[k + 1]->pn;
    if (k + 2 < path->n) {
      path_local._4_4_ = check_assoc_priority(pn1,pPVar1,path->v[k + 2]->pn);
    }
    else {
      pZVar2 = path->v[k + 1];
      for (kk = 0; kk < (pZVar2->sns).n; kk = kk + 1) {
        for (jj = 0; jj < ((pZVar2->sns).v[kk]->zns).n; jj = jj + 1) {
          bVar5 = true;
          pZVar3 = ((pZVar2->sns).v[kk]->zns).v[jj];
          if ((pZVar3 != (ZNode *)0x0) &&
             (iVar6 = check_assoc_priority(pn1,pPVar1,pZVar3->pn), iVar6 == 0)) {
            return 0;
          }
        }
      }
      if (bVar5) {
        path_local._4_4_ = -1;
      }
      else {
        path_local._4_4_ = check_assoc_priority(pn1,pPVar1,(PNode *)0x0);
      }
    }
  }
  else {
    pZVar2 = path->v[k];
    for (kk = 0; kk < (pZVar2->sns).n; kk = kk + 1) {
      for (jj = 0; jj < ((pZVar2->sns).v[kk]->zns).n; jj = jj + 1) {
        pZVar3 = ((pZVar2->sns).v[kk]->zns).v[jj];
        if (pZVar3 != (ZNode *)0x0) {
          for (z._4_4_ = 0; z._4_4_ < (pZVar3->sns).n; z._4_4_ = z._4_4_ + 1) {
            for (one = 0; one < ((pZVar3->sns).v[z._4_4_]->zns).n; one = one + 1) {
              pZVar4 = ((pZVar3->sns).v[z._4_4_]->zns).v[one];
              if ((pZVar4 != (ZNode *)0x0) &&
                 (iVar6 = check_assoc_priority(pn1,pZVar3->pn,pZVar4->pn), iVar6 == 0)) {
                return 0;
              }
            }
          }
        }
      }
    }
    path_local._4_4_ = 0;
  }
  return path_local._4_4_;
}

Assistant:

static int check_path_priorities_internal(VecZNode *path) {
  uint i = 0, j, k, jj, kk, one = 0;
  ZNode *z, *zz, *zzz;
  PNode *pn0, *pn1;

  if (path->n < i + 1) return 0;
  pn0 = path->v[i]->pn;
  if (!pn0->op_assoc) { /* deal with top expression directly */
    i = 1;
    if (path->n < i + 1) return 0;
    pn1 = path->v[i]->pn;
    if (!pn1->op_assoc) return 0;
    if (pn0->assoc) {
      if (!check_child(pn1->op_priority, pn1->op_assoc, pn0->priority, pn0->assoc, 0, 1)) return -1;
    }
    pn0 = pn1;
  }
  if (path->n > i + 1) { /* entirely in the path */
    pn1 = path->v[i + 1]->pn;
    if (path->n > i + 2)
      return check_assoc_priority(pn0, pn1, path->v[i + 2]->pn);
    else { /* one level from the stack beyond the path */
      z = path->v[i + 1];
      for (k = 0; k < z->sns.n; k++)
        for (j = 0; j < z->sns.v[k]->zns.n; j++) {
          one = 1;
          zz = z->sns.v[k]->zns.v[j];
          if (zz && !check_assoc_priority(pn0, pn1, zz->pn)) return 0;
        }
      if (!one) return check_assoc_priority(pn0, pn1, NULL);
    }
  } else { /* two levels from the stack beyond the path */
    z = path->v[i];
    for (k = 0; k < z->sns.n; k++)
      for (j = 0; j < z->sns.v[k]->zns.n; j++) {
        zz = z->sns.v[k]->zns.v[j];
        if (zz)
          for (kk = 0; kk < zz->sns.n; kk++)
            for (jj = 0; jj < zz->sns.v[kk]->zns.n; jj++) {
              one = 1;
              zzz = zz->sns.v[kk]->zns.v[jj];
              if (zzz && !check_assoc_priority(pn0, zz->pn, zzz->pn)) return 0;
            }
      }
    return 0;
  }
  return -1;
}